

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O1

map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
* __thiscall
LatencyItem::dumpHistogram
          (map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
           *__return_storage_ptr__,LatencyItem *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  pair<unsigned_long,_unsigned_long> local_30;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar4 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    if ((this->hist).bins[uVar4].super___atomic_base<unsigned_long>._M_i != 0) goto LAB_00105af5;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x41);
  uVar4 = 0x41;
LAB_00105af5:
  if (uVar4 != 0x41) {
    do {
      local_30.second = (this->hist).bins[uVar4].super___atomic_base<unsigned_long>._M_i;
      if (local_30.second != 0) {
        local_30.first = -(ulong)(uVar4 == 0) | 1L << ((ulong)(byte)(0x40 - (char)uVar4) & 0x3f);
        std::
        _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
        ::_M_emplace_unique<std::pair<unsigned_long,unsigned_long>>
                  ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                    *)__return_storage_ptr__,&local_30);
      }
      uVar3 = 0x40;
      if (uVar4 < 0x40) {
        uVar3 = uVar4;
      }
      bVar2 = uVar4 < 0x40;
      uVar4 = uVar3 + 1;
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<double, uint64_t> dumpHistogram() const {
        std::map<double, uint64_t> ret;
        for (auto& entry: hist) {
            HistItr& itr = entry;
            uint64_t cnt = itr.getCount();
            if (cnt) {
                ret.insert( std::make_pair(itr.getUpperBound(), cnt) );
            }
        }
        return ret;
    }